

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QControlledGate2.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::QControlledGate2<std::complex<float>_>::matrix
          (QControlledGate2<std::complex<float>_> *this)

{
  _Head_base<0UL,_std::complex<float>_*,_false> _Var1;
  int iVar2;
  int64_t i;
  long lVar3;
  long *plVar4;
  _Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_> extraout_RDX;
  complex<float> *extraout_RDX_00;
  complex<float> *extraout_RDX_01;
  complex<float> *extraout_RDX_02;
  complex<float> *extraout_RDX_03;
  _Head_base<0UL,_std::complex<float>_*,_false> extraout_RDX_04;
  complex<float> *extraout_RDX_05;
  __uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_> extraout_RDX_06;
  tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_> extraout_RDX_07;
  long *in_RSI;
  pointer *__ptr;
  data_type *pdVar6;
  SquareMatrix<std::complex<float>_> SVar7;
  SquareMatrix<std::complex<float>_> mat;
  SquareMatrix<std::complex<float>_> local_b0;
  SquareMatrix<std::complex<float>_> local_a0;
  SquareMatrix<std::complex<float>_> local_90;
  SquareMatrix<std::complex<float>_> local_80;
  SquareMatrix<std::complex<float>_> local_70;
  SquareMatrix<std::complex<float>_> local_60;
  SquareMatrix<std::complex<float>_> local_50;
  SquareMatrix<std::complex<float>_> local_40;
  SquareMatrix<std::complex<float>_> local_30;
  _Head_base<0UL,_std::complex<float>_*,_false> _Var5;
  
  local_a0.size_ = 2;
  local_a0.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  *(undefined8 *)
   local_a0.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_a0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_a0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_a0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) = 0;
  lVar3 = 0;
  do {
    ((undefined8 *)
    (local_a0.size_ * lVar3 * 8 +
    (long)local_a0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl))[lVar3] = 0x3f800000;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 2);
  local_80.size_ = 2;
  local_80.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  *(undefined8 *)
   local_80.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = 0x3f800000;
  *(undefined8 *)
   ((long)local_80.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_80.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_80.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) = 0;
  local_90.size_ = 2;
  local_90.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )operator_new__(0x20);
  *(undefined8 *)
   local_90.data_._M_t.
   super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
   super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
   super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = 0;
  *(undefined8 *)
   ((long)local_90.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 8) = 0;
  *(undefined8 *)
   ((long)local_90.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined8 *)
   ((long)local_90.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl + 0x18) = 0x3f800000;
  plVar4 = (long *)(**(code **)(*in_RSI + 0x80))();
  (**(code **)(*plVar4 + 0x38))(&local_70,plVar4);
  lVar3 = in_RSI[1];
  if (*(int *)((long)in_RSI + 0xc) == 0) {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar3 < iVar2) {
      dense::kron<std::complex<float>>((dense *)&local_30,&local_80,&local_70);
      dense::kron<std::complex<float>>((dense *)&local_b0,&local_90,&local_a0);
      SVar7 = dense::operator+((dense *)this,&local_30,&local_b0);
      _Var5._M_head_impl =
           (complex<float> *)
           SVar7.data_._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_std::complex<float>_*,_false>)
          local_b0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
        ;
        _Var5._M_head_impl = extraout_RDX_00;
      }
      pdVar6 = &local_30.data_;
    }
    else {
      dense::kron<std::complex<float>>((dense *)&local_40,&local_70,&local_80);
      dense::kron<std::complex<float>>((dense *)&local_b0,&local_a0,&local_90);
      SVar7 = dense::operator+((dense *)this,&local_40,&local_b0);
      _Var5._M_head_impl =
           (complex<float> *)
           SVar7.data_._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_std::complex<float>_*,_false>)
          local_b0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
        ;
        _Var5._M_head_impl = extraout_RDX_02;
      }
      pdVar6 = &local_40.data_;
    }
  }
  else {
    iVar2 = (**(code **)(*in_RSI + 0x78))();
    if ((int)lVar3 < iVar2) {
      dense::kron<std::complex<float>>((dense *)&local_50,&local_80,&local_a0);
      dense::kron<std::complex<float>>((dense *)&local_b0,&local_90,&local_70);
      SVar7 = dense::operator+((dense *)this,&local_50,&local_b0);
      _Var5._M_head_impl =
           (complex<float> *)
           SVar7.data_._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_std::complex<float>_*,_false>)
          local_b0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
        ;
        _Var5._M_head_impl =
             (complex<float> *)
             extraout_RDX.super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
      }
      pdVar6 = &local_50.data_;
    }
    else {
      dense::kron<std::complex<float>>((dense *)&local_60,&local_a0,&local_80);
      dense::kron<std::complex<float>>((dense *)&local_b0,&local_70,&local_90);
      SVar7 = dense::operator+((dense *)this,&local_60,&local_b0);
      _Var5._M_head_impl =
           (complex<float> *)
           SVar7.data_._M_t.
           super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
           _M_t.
           super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
           .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
      if ((_Head_base<0UL,_std::complex<float>_*,_false>)
          local_b0.data_._M_t.
          super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>.
          _M_t.
          super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
          .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
          (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
        operator_delete__((void *)local_b0.data_._M_t.
                                  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                                  .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl)
        ;
        _Var5._M_head_impl = extraout_RDX_01;
      }
      pdVar6 = &local_60.data_;
    }
  }
  _Var1._M_head_impl =
       (pdVar6->_M_t).
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  if (_Var1._M_head_impl != (complex<float> *)0x0) {
    operator_delete__(_Var1._M_head_impl);
    _Var5._M_head_impl = extraout_RDX_03;
  }
  (pdVar6->_M_t).
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl = (complex<float> *)0x0;
  if ((tuple<std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
      local_70.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (_Head_base<0UL,_std::complex<float>_*,_false>)0x0) {
    operator_delete__((void *)local_70.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
    _Var5._M_head_impl = extraout_RDX_04._M_head_impl;
  }
  if (local_90.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_90.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
    _Var5._M_head_impl = extraout_RDX_05;
  }
  if ((_Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>)
      local_80.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl != (complex<float> *)0x0) {
    operator_delete__((void *)local_80.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
    _Var5._M_head_impl =
         (complex<float> *)
         extraout_RDX_06._M_t.
         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
         super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  }
  if (local_a0.data_._M_t.
      super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
      super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
      super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl !=
      (__uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>)0x0) {
    operator_delete__((void *)local_a0.data_._M_t.
                              super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>
                              .super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl);
    _Var5._M_head_impl =
         (complex<float> *)
         extraout_RDX_07.
         super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
         super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  }
  SVar7.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       (__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
       )(__uniq_ptr_data<std::complex<float>,_std::default_delete<std::complex<float>[]>,_true,_true>
         )_Var5._M_head_impl;
  SVar7.size_ = (size_type_conflict)this;
  return SVar7;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          using matrix_type = qclab::dense::SquareMatrix< T > ;
          const matrix_type  I2 = qclab::dense::eye< T >( 2 ) ;
          const matrix_type  E0( 1 , 0 ,
                                 0 , 0 ) ;
          const matrix_type  E1( 0 , 0 ,
                                 0 , 1 ) ;
          const matrix_type  CG = this->gate()->matrix() ;
          if ( controlState_ == 0 ) {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , CG ) +
                     qclab::dense::kron( E1 , I2 ) ;
            } else {
              return qclab::dense::kron( CG , E0 ) +
                     qclab::dense::kron( I2 , E1 ) ;
            }
          } else {
            if ( control() < target() ) {
              return qclab::dense::kron( E0 , I2 ) +
                     qclab::dense::kron( E1 , CG ) ;
            } else {
              return qclab::dense::kron( I2 , E0 ) +
                     qclab::dense::kron( CG , E1 ) ;
            }
          }
        }